

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<HighsCDouble>::reIndex(HVectorBase<HighsCDouble> *this)

{
  int iVar1;
  reference this_00;
  reference pvVar2;
  int *in_RDI;
  double dVar3;
  HighsInt i;
  int local_c;
  
  if ((in_RDI[1] < 0) || ((double)*in_RDI * 0.1 < (double)in_RDI[1])) {
    in_RDI[1] = 0;
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      this_00 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                          ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 8),
                           (long)local_c);
      dVar3 = HighsCDouble::operator_cast_to_double(this_00);
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        iVar1 = in_RDI[1];
        in_RDI[1] = iVar1 + 1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)iVar1);
        *pvVar2 = local_c;
      }
    }
  }
  return;
}

Assistant:

void HVectorBase<Real>::reIndex() {
  /*
   * Possibly determine the indices from scratch by passing through
   * the array
   */
  // Don't do it if there are relatively few nonzeros
  if (count >= 0 && count <= size * 0.1) return;
  count = 0;
  for (HighsInt i = 0; i < size; i++)
    if ((double)array[i]) index[count++] = i;
}